

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

UniValue *
generateBlocks(UniValue *__return_storage_ptr__,ChainstateManager *chainman,Mining *miner,
              CScript *coinbase_script,int nGenerate,uint64_t nMaxTries)

{
  string str;
  UniValue val;
  bool bVar1;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  ChainstateManager *pCVar2;
  shared_ptr<const_CBlock> block_out;
  undefined8 uStack_108;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  uint64_t nMaxTries_local;
  base_blob<256u> local_f0 [32];
  UniValue local_d0;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_dataplus._M_p._4_4_ = nGenerate;
  str._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffec8;
  str._M_string_length = (size_type)__return_storage_ptr__;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
  str.field_2._8_8_ = coinbase_script;
  nMaxTries_local = nMaxTries;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_58);
  pCVar2 = chainman;
  do {
    if ((nGenerate < 1) ||
       (bVar1 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt), bVar1)) break;
    local_78._M_dataplus._M_p._0_1_ = 1;
    local_78._M_string_length = 4000;
    local_78.field_2._M_allocated_capacity = 400;
    (*miner->_vptr_Mining[5])(&pblocktemplate,miner,coinbase_script,&local_78);
    if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
        pblocktemplate._M_t.
        super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t
        .super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
        super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Couldn\'t create new block",(allocator<char> *)local_f0);
      JSONRPCError(__return_storage_ptr___00,-0x7f5b,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0083482e;
    }
    block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar1 = GenerateBlock(chainman,miner,
                          (CBlock *)
                          pblocktemplate._M_t.
                          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl,
                          &nMaxTries_local,&block_out,true);
    if ((bVar1) &&
       (chainman = pCVar2,
       block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) {
      CBlockHeader::GetHash
                ((uint256 *)local_f0,
                 &(block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      base_blob<256u>::GetHex_abi_cxx11_(&local_78,local_f0);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_d0,&local_78);
      val._4_4_ = nGenerate;
      val.typ = in_stack_fffffffffffffec8;
      val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      val.val._M_string_length = (size_type)pCVar2;
      val.val.field_2._M_allocated_capacity = (size_type)coinbase_script;
      val.val.field_2._8_8_ =
           block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_108;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pblocktemplate._M_t.
                    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                    .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)nMaxTries_local;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._8_16_ = local_f0._0_16_;
      UniValue::push_back(__return_storage_ptr__,val);
      nGenerate = nGenerate + -1;
      UniValue::~UniValue(&local_d0);
      chainman = pCVar2;
      std::__cxx11::string::~string((string *)&local_78);
      pCVar2 = chainman;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
              (&pblocktemplate);
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0083482e:
  __stack_chk_fail();
}

Assistant:

static UniValue generateBlocks(ChainstateManager& chainman, Mining& miner, const CScript& coinbase_script, int nGenerate, uint64_t nMaxTries)
{
    UniValue blockHashes(UniValue::VARR);
    while (nGenerate > 0 && !chainman.m_interrupt) {
        std::unique_ptr<CBlockTemplate> pblocktemplate(miner.createNewBlock(coinbase_script));
        if (!pblocktemplate.get())
            throw JSONRPCError(RPC_INTERNAL_ERROR, "Couldn't create new block");

        std::shared_ptr<const CBlock> block_out;
        if (!GenerateBlock(chainman, miner, pblocktemplate->block, nMaxTries, block_out, /*process_new_block=*/true)) {
            break;
        }

        if (block_out) {
            --nGenerate;
            blockHashes.push_back(block_out->GetHash().GetHex());
        }
    }
    return blockHashes;
}